

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parseCWL.cpp
# Opt level: O0

Classification *
identifyClassfification(Classification *__return_storage_ptr__,string *classification)

{
  ulong uVar1;
  ulong uVar2;
  undefined1 *puVar3;
  ulong uStack_28;
  value_type c;
  size_t i;
  string *local_18;
  string *classification_local;
  Classification *result;
  
  i._7_1_ = 0;
  __return_storage_ptr__->extended = false;
  __return_storage_ptr__->visible = true;
  __return_storage_ptr__->classKind = None;
  __return_storage_ptr__->defKind = None;
  __return_storage_ptr__->sectionLevel = 0;
  local_18 = classification;
  classification_local = (string *)__return_storage_ptr__;
  memset(&__return_storage_ptr__->validEnvs,0,0x18);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&__return_storage_ptr__->validEnvs);
  std::__cxx11::string::string((string *)&__return_storage_ptr__->behavesLike);
  for (uStack_28 = 0; uVar1 = uStack_28, uVar2 = std::__cxx11::string::size(), uVar1 < uVar2;
      uStack_28 = uStack_28 + 1) {
    puVar3 = (undefined1 *)std::__cxx11::string::operator[]((ulong)local_18);
    switch(*puVar3) {
    case 0x2a:
      __return_storage_ptr__->extended = true;
      break;
    default:
      return __return_storage_ptr__;
    case 0x2f:
      uStack_28 = uStack_28 + 1;
      extractValidEnvs(__return_storage_ptr__,local_18,&stack0xffffffffffffffd8);
      break;
    case 0x42:
      __return_storage_ptr__->defKind = Color;
      break;
    case 0x43:
      __return_storage_ptr__->defKind = Citation;
      break;
    case 0x44:
      __return_storage_ptr__->defKind = Todo;
      break;
    case 0x4b:
      __return_storage_ptr__->defKind = Bracketlike;
      break;
    case 0x4c:
      __return_storage_ptr__->defKind = Structure;
      uStack_28 = uStack_28 + 1;
      extractStructureLevel(__return_storage_ptr__,local_18,&stack0xffffffffffffffd8);
      break;
    case 0x4d:
      break;
    case 0x4e:
      __return_storage_ptr__->defKind = Newtheorem;
      break;
    case 0x53:
      __return_storage_ptr__->visible = false;
      break;
    case 0x54:
      __return_storage_ptr__->classKind = Tabbing;
      break;
    case 0x55:
      __return_storage_ptr__->defKind = Url;
      break;
    case 0x56:
      __return_storage_ptr__->defKind = Verbatim;
      break;
    case 0x5c:
      uStack_28 = uStack_28 + 1;
      extractLikeEnv(__return_storage_ptr__,local_18,&stack0xffffffffffffffd8);
      break;
    case 0x62:
      __return_storage_ptr__->defKind = Bibliography;
      break;
    case 99:
      __return_storage_ptr__->defKind = Citation;
      break;
    case 100:
      __return_storage_ptr__->defKind = Definition;
      break;
    case 0x67:
      __return_storage_ptr__->defKind = Graphics;
      break;
    case 0x69:
      __return_storage_ptr__->defKind = File;
      break;
    case 0x6c:
      __return_storage_ptr__->defKind = Label;
      break;
    case 0x6d:
      __return_storage_ptr__->classKind = Math;
      break;
    case 0x6e:
      __return_storage_ptr__->classKind = Text;
      break;
    case 0x72:
      __return_storage_ptr__->defKind = Reference;
      break;
    case 0x73:
      __return_storage_ptr__->defKind = Special;
      break;
    case 0x74:
      __return_storage_ptr__->classKind = Tabular;
      break;
    case 0x75:
      __return_storage_ptr__->defKind = Package;
    }
  }
  return __return_storage_ptr__;
}

Assistant:

Classification identifyClassfification (string &classification) {
    Classification result {};

    for (size_t i = 0; i < classification.size(); i++) {
        auto c = classification[i];
        switch (c) {
            case '*': result.extended = true; break;
            case 'S': result.visible = false; break;
            case 'M': break; // TODO
            case 'm': result.classKind = ClassKind::Math; break;
            case 't': result.classKind = ClassKind::Tabular; break;
            case 'T': result.classKind = ClassKind::Tabbing; break;
            case 'n': result.classKind = ClassKind::Text; break;
            case 'r': result.defKind = DefKind::Reference; break;
            case 'c': result.defKind = DefKind::Citation; break;
            case 'C': result.defKind = DefKind::Citation; break; // TODO
            case 'l': result.defKind = DefKind::Label; break;
            case 'd': result.defKind = DefKind::Definition; break;
            case 'g': result.defKind = DefKind::Graphics; break;
            case 'i': result.defKind = DefKind::File; break;
            case 'u': result.defKind = DefKind::Package; break;
            case 'b': result.defKind = DefKind::Bibliography; break;
            case 'U': result.defKind = DefKind::Url; break;
            case 'K': result.defKind = DefKind::Bracketlike; break;
            case 'D': result.defKind = DefKind::Todo; break;
            case 'B': result.defKind = DefKind::Color; break;
            case 's': result.defKind = DefKind::Special; break;
            case 'V': result.defKind = DefKind::Verbatim; break;
            case 'N': result.defKind = DefKind::Newtheorem; break;
            case 'L':
                result.defKind = DefKind::Structure;
                extractStructureLevel(result, classification, ++i);
                break;
            case '/':
                extractValidEnvs(result, classification, ++i);
                break;
            case '\\':
                extractLikeEnv(result, classification, ++i);
                break;
            default: {
                return result; // skip unknown
            }
        }
    }

    return result;
}